

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_91bd::verifyImagesAreEqual(FlatImage *img1,FlatImage *img2,int dx,int dy)

{
  LevelMode LVar1;
  LevelMode LVar2;
  LevelRoundingMode LVar3;
  LevelRoundingMode LVar4;
  int iVar5;
  int iVar6;
  ArgExc *pAVar7;
  ostream *poVar8;
  Image *in_RSI;
  Image *in_RDI;
  int in_stack_00000040;
  int in_stack_00000044;
  FlatImageLevel *in_stack_00000048;
  FlatImageLevel *in_stack_00000050;
  int x_1;
  int y;
  int x;
  Image *in_stack_ffffffffffffff80;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  LVar1 = Imf_2_5::Image::levelMode(in_RDI);
  LVar2 = Imf_2_5::Image::levelMode(in_RSI);
  if (LVar1 != LVar2) {
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar7,"different level modes");
    __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  LVar3 = Imf_2_5::Image::levelRoundingMode(in_RDI);
  LVar4 = Imf_2_5::Image::levelRoundingMode(in_RSI);
  if (LVar3 == LVar4) {
    iVar5 = Imf_2_5::Image::numXLevels((Image *)0x114fcf);
    iVar6 = Imf_2_5::Image::numXLevels((Image *)0x114fdd);
    if (iVar5 == iVar6) {
      iVar5 = Imf_2_5::Image::numYLevels((Image *)0x114ff4);
      iVar6 = Imf_2_5::Image::numYLevels((Image *)0x115002);
      if (iVar5 == iVar6) {
        LVar1 = Imf_2_5::Image::levelMode(in_RDI);
        if (LVar1 == ONE_LEVEL) {
          poVar8 = std::operator<<((ostream *)&std::cout,"        level 0");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          (*in_RDI->_vptr_Image[4])(in_RDI,0);
          (*in_RSI->_vptr_Image[4])(in_RSI,0);
          verifyLevelsAreEqual
                    (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040);
        }
        else if (LVar1 == MIPMAP_LEVELS) {
          for (local_1c = 0; iVar5 = Imf_2_5::Image::numLevels(in_stack_ffffffffffffff80),
              (int)local_1c < iVar5; local_1c = local_1c + 1) {
            poVar8 = std::operator<<((ostream *)&std::cout,"        level ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1c);
            poVar8 = std::operator<<(poVar8,"");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            (*in_RDI->_vptr_Image[4])(in_RDI,(ulong)local_1c);
            (*in_RSI->_vptr_Image[4])(in_RSI,(ulong)local_1c);
            verifyLevelsAreEqual
                      (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040);
          }
        }
        else {
          if (LVar1 != RIPMAP_LEVELS) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testFlatImage.cpp"
                          ,0xd2,
                          "void (anonymous namespace)::verifyImagesAreEqual(const FlatImage &, const FlatImage &, int, int)"
                         );
          }
          for (local_20 = 0; iVar5 = Imf_2_5::Image::numYLevels((Image *)0x1151ab),
              (int)local_20 < iVar5; local_20 = local_20 + 1) {
            for (local_24 = 0; iVar5 = Imf_2_5::Image::numXLevels((Image *)0x1151d6),
                (int)local_24 < iVar5; local_24 = local_24 + 1) {
              poVar8 = std::operator<<((ostream *)&std::cout,"        level (");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_24);
              poVar8 = std::operator<<(poVar8,", ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_20);
              poVar8 = std::operator<<(poVar8,")");
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              (*in_RDI->_vptr_Image[6])(in_RDI,(ulong)local_24,(ulong)local_20);
              (*in_RSI->_vptr_Image[6])(in_RSI,(ulong)local_24,(ulong)local_20);
              verifyLevelsAreEqual
                        (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040);
            }
          }
        }
        return;
      }
    }
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar7,"different number of levels");
    __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar7,"different level rounding modes");
  __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
verifyImagesAreEqual
    (const FlatImage &img1,
     const FlatImage &img2,
     int dx = 0,
     int dy = 0)
{
    if (img1.levelMode() != img2.levelMode())
        throw ArgExc ("different level modes");

    if (img1.levelRoundingMode() != img2.levelRoundingMode())
        throw ArgExc ("different level rounding modes");

    if (img1.numXLevels() != img2.numXLevels() ||
        img1.numYLevels() != img2.numYLevels())
        throw ArgExc ("different number of levels");

    switch (img1.levelMode())
    {
      case ONE_LEVEL:

        cout << "        level 0" << endl;

        verifyLevelsAreEqual
            (img1.level(), img2.level(), dx, dy);

        break;

      case MIPMAP_LEVELS:

        for (int x = 0; x < img1.numLevels(); ++x)
        {
            cout << "        level " << x << "" << endl;

            verifyLevelsAreEqual
                (img1.level (x), img2.level (x), dx, dy);
        }

        break;

      case RIPMAP_LEVELS:

        for (int y = 0; y < img1.numYLevels(); ++y)
        {
            for (int x = 0; x < img1.numXLevels(); ++x)
            {
                cout << "        level (" << x << ", " << y << ")" << endl;

                verifyLevelsAreEqual
                    (img1.level (x, y), img2.level (x, y), dx, dy);
            }
        }

        break;

      default:

        assert (false);
    }
}